

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

matrix * __thiscall matrix::operator=(matrix *this,matrix *v)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2._0_4_ = v->nl_;
  uVar2._4_4_ = v->nc_;
  this->nl_ = (undefined4)uVar2;
  this->nc_ = uVar2._4_4_;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)(undefined4)uVar2) {
    uVar6 = uVar2 & 0xffffffff;
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    iVar1 = v->nc_;
    pdVar3 = this->data_;
    pdVar4 = v->data_;
    for (uVar9 = 0; (uVar2 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)pdVar3 + uVar9 * 8 + lVar7) =
           *(undefined8 *)((long)pdVar4 + uVar9 * 8 + iVar1 * lVar5);
    }
    lVar7 = lVar7 + (long)(int)(undefined4)uVar2 * 8;
    lVar5 = lVar5 + 8;
  }
  return this;
}

Assistant:

matrix& matrix::operator= (const matrix& v){
    nl_ = v.get_nl();
    nc_ = v.get_nc();
    for(int i = 0; i < v.get_nl(); i++){
        for(int j = 0; j < v.get_nl(); j++){
            data_[i*get_nl()+j] = v(i, j);
        }
    }
    return *this;
}